

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_1048576,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined1 auVar6 [32];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  BaseNode_conflict *node;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  uint uVar46;
  ulong *puVar47;
  ulong uVar48;
  long lVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  float fVar54;
  float fVar59;
  float fVar60;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar61;
  undefined1 auVar58 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  float fVar91;
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  uint uVar110;
  uint uVar111;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  uint uVar112;
  undefined1 auVar109 [32];
  undefined1 auVar113 [16];
  float fVar114;
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar115 [64];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [16];
  undefined1 auVar126 [64];
  undefined1 auVar127 [16];
  undefined1 auVar128 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_14ac;
  undefined1 local_14a8 [16];
  undefined1 local_1498 [16];
  undefined1 local_1488 [16];
  RayQueryContext *local_1470;
  undefined1 local_1468 [16];
  undefined1 local_1458 [16];
  undefined1 local_1448 [16];
  long local_1430;
  long local_1428;
  long local_1420;
  ulong local_1418;
  ulong *local_1410;
  undefined4 local_1408;
  undefined4 local_1404;
  undefined4 local_1400;
  undefined4 local_13fc;
  undefined4 local_13f8;
  undefined4 local_13f4;
  uint local_13f0;
  uint local_13ec;
  uint local_13e8;
  int *local_13d8;
  undefined8 local_13d0;
  RTCRayQueryContext *local_13c8;
  Ray *local_13c0;
  undefined4 *local_13b8;
  undefined4 local_13b0;
  undefined1 local_13a8 [16];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  float local_1318 [4];
  undefined1 local_1308 [16];
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [8];
  float fStack_11f0;
  float fStack_11ec;
  float fStack_11e8;
  float fStack_11e4;
  float fStack_11e0;
  ulong local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar54 = ray->tfar;
    if (0.0 <= fVar54) {
      local_1470 = context;
      local_1410 = local_11d0;
      aVar5 = (ray->dir).field_0;
      auVar55 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar87._8_4_ = 0x7fffffff;
      auVar87._0_8_ = 0x7fffffff7fffffff;
      auVar87._12_4_ = 0x7fffffff;
      auVar87 = vandps_avx((undefined1  [16])aVar5,auVar87);
      auVar92._8_4_ = 0x219392ef;
      auVar92._0_8_ = 0x219392ef219392ef;
      auVar92._12_4_ = 0x219392ef;
      auVar87 = vcmpps_avx(auVar87,auVar92,1);
      auVar87 = vblendvps_avx((undefined1  [16])aVar5,auVar92,auVar87);
      auVar92 = vrcpps_avx(auVar87);
      fVar59 = auVar92._0_4_;
      auVar83._0_4_ = fVar59 * auVar87._0_4_;
      fVar60 = auVar92._4_4_;
      auVar83._4_4_ = fVar60 * auVar87._4_4_;
      fVar61 = auVar92._8_4_;
      auVar83._8_4_ = fVar61 * auVar87._8_4_;
      fVar91 = auVar92._12_4_;
      auVar83._12_4_ = fVar91 * auVar87._12_4_;
      auVar93._8_4_ = 0x3f800000;
      auVar93._0_8_ = 0x3f8000003f800000;
      auVar93._12_4_ = 0x3f800000;
      auVar87 = vsubps_avx(auVar93,auVar83);
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      local_1258._4_4_ = uVar4;
      local_1258._0_4_ = uVar4;
      local_1258._8_4_ = uVar4;
      local_1258._12_4_ = uVar4;
      local_1258._16_4_ = uVar4;
      local_1258._20_4_ = uVar4;
      local_1258._24_4_ = uVar4;
      local_1258._28_4_ = uVar4;
      auVar115 = ZEXT3264(local_1258);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1278._4_4_ = uVar4;
      local_1278._0_4_ = uVar4;
      local_1278._8_4_ = uVar4;
      local_1278._12_4_ = uVar4;
      local_1278._16_4_ = uVar4;
      local_1278._20_4_ = uVar4;
      local_1278._24_4_ = uVar4;
      local_1278._28_4_ = uVar4;
      auVar123 = ZEXT3264(local_1278);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1298._4_4_ = uVar4;
      local_1298._0_4_ = uVar4;
      local_1298._8_4_ = uVar4;
      local_1298._12_4_ = uVar4;
      local_1298._16_4_ = uVar4;
      local_1298._20_4_ = uVar4;
      local_1298._24_4_ = uVar4;
      local_1298._28_4_ = uVar4;
      auVar124 = ZEXT3264(local_1298);
      auVar84._0_4_ = fVar59 + fVar59 * auVar87._0_4_;
      auVar84._4_4_ = fVar60 + fVar60 * auVar87._4_4_;
      auVar84._8_4_ = fVar61 + fVar61 * auVar87._8_4_;
      auVar84._12_4_ = fVar91 + fVar91 * auVar87._12_4_;
      auVar87 = vshufps_avx(auVar84,auVar84,0);
      local_12b8._16_16_ = auVar87;
      local_12b8._0_16_ = auVar87;
      auVar126 = ZEXT3264(local_12b8);
      auVar87 = vmovshdup_avx(auVar84);
      auVar92 = vshufps_avx(auVar84,auVar84,0x55);
      local_12d8._16_16_ = auVar92;
      local_12d8._0_16_ = auVar92;
      auVar128 = ZEXT3264(local_12d8);
      auVar92 = vshufpd_avx(auVar84,auVar84,1);
      auVar83 = vshufps_avx(auVar84,auVar84,0xaa);
      local_1418 = (ulong)(auVar84._0_4_ < 0.0) << 3;
      register0x000012d0 = auVar83;
      _local_11f8 = auVar83;
      uVar42 = (ulong)(auVar87._0_4_ < 0.0);
      lVar1 = uVar42 * 8;
      uVar43 = (ulong)(auVar92._0_4_ < 0.0);
      lVar2 = uVar43 * 8;
      auVar87 = vshufps_avx(auVar55,auVar55,0);
      local_1218._16_16_ = auVar87;
      local_1218._0_16_ = auVar87;
      auVar87 = vshufps_avx(ZEXT416((uint)fVar54),ZEXT416((uint)fVar54),0);
      local_1238._16_16_ = auVar87;
      local_1238._0_16_ = auVar87;
      uVar51 = local_1418 ^ 8;
      uVar50 = lVar1 + 0x10U ^ 8;
      uVar53 = lVar2 + 0x20U ^ 8;
      local_13a8 = mm_lookupmask_ps._240_16_;
LAB_002ef154:
      do {
        uVar52 = local_1410[-1];
        local_1410 = local_1410 + -1;
        while ((uVar52 & 8) == 0) {
          uVar44 = uVar52 & 0xfffffffffffffff0;
          puVar47 = (ulong *)(uVar44 + 0x40);
          if (uVar44 == 0) {
            puVar47 = (ulong *)0x0;
          }
          auVar55._8_8_ = 0;
          auVar55._0_8_ = *puVar47;
          auVar73._8_8_ = 0;
          auVar73._0_8_ = puVar47[1];
          auVar87 = vpminub_avx(auVar55,auVar73);
          auVar87 = vpcmpeqb_avx(auVar55,auVar87);
          auVar62._8_8_ = 0;
          auVar62._0_8_ = *(ulong *)((long)puVar47 + 4);
          auVar85._8_8_ = 0;
          auVar85._0_8_ = *(ulong *)((long)puVar47 + 0xc);
          auVar55 = vpminub_avx(auVar62,auVar85);
          fVar54 = *(float *)(puVar47 + 6);
          auVar55 = vpcmpeqb_avx(auVar62,auVar55);
          fVar59 = *(float *)((long)puVar47 + 0x3c);
          auVar74._8_8_ = 0;
          auVar74._0_8_ = *(ulong *)((long)puVar47 + local_1418);
          auVar92 = vpmovzxbd_avx(auVar74);
          auVar94._8_8_ = 0;
          auVar94._0_8_ = *(ulong *)((long)puVar47 + local_1418 + 4);
          auVar83 = vpmovzxbd_avx(auVar94);
          auVar81._16_16_ = auVar83;
          auVar81._0_16_ = auVar92;
          auVar81 = vcvtdq2ps_avx(auVar81);
          auVar82._0_4_ = fVar54 + fVar59 * auVar81._0_4_;
          auVar82._4_4_ = fVar54 + fVar59 * auVar81._4_4_;
          auVar82._8_4_ = fVar54 + fVar59 * auVar81._8_4_;
          auVar82._12_4_ = fVar54 + fVar59 * auVar81._12_4_;
          auVar82._16_4_ = fVar54 + fVar59 * auVar81._16_4_;
          auVar82._20_4_ = fVar54 + fVar59 * auVar81._20_4_;
          auVar82._24_4_ = fVar54 + fVar59 * auVar81._24_4_;
          auVar82._28_4_ = fVar54 + auVar81._28_4_;
          auVar95._8_8_ = 0;
          auVar95._0_8_ = *(ulong *)((long)puVar47 + uVar51);
          auVar92 = vpmovzxbd_avx(auVar95);
          auVar98._8_8_ = 0;
          auVar98._0_8_ = *(ulong *)((long)puVar47 + uVar51 + 4);
          auVar83 = vpmovzxbd_avx(auVar98);
          auVar96._16_16_ = auVar83;
          auVar96._0_16_ = auVar92;
          auVar81 = vcvtdq2ps_avx(auVar96);
          fVar60 = *(float *)((long)puVar47 + 0x34);
          auVar86._0_4_ = fVar54 + fVar59 * auVar81._0_4_;
          auVar86._4_4_ = fVar54 + fVar59 * auVar81._4_4_;
          auVar86._8_4_ = fVar54 + fVar59 * auVar81._8_4_;
          auVar86._12_4_ = fVar54 + fVar59 * auVar81._12_4_;
          auVar86._16_4_ = fVar54 + fVar59 * auVar81._16_4_;
          auVar86._20_4_ = fVar54 + fVar59 * auVar81._20_4_;
          auVar86._24_4_ = fVar54 + fVar59 * auVar81._24_4_;
          auVar86._28_4_ = fVar54 + fVar59;
          fVar54 = *(float *)(puVar47 + 8);
          auVar88._8_8_ = 0;
          auVar88._0_8_ = puVar47[uVar42 + 2];
          auVar92 = vpmovzxbd_avx(auVar88);
          auVar100._8_8_ = 0;
          auVar100._0_8_ = *(ulong *)((long)puVar47 + lVar1 + 0x14);
          auVar83 = vpmovzxbd_avx(auVar100);
          auVar89._16_16_ = auVar83;
          auVar89._0_16_ = auVar92;
          auVar81 = vcvtdq2ps_avx(auVar89);
          auVar90._0_4_ = fVar60 + fVar54 * auVar81._0_4_;
          auVar90._4_4_ = fVar60 + fVar54 * auVar81._4_4_;
          auVar90._8_4_ = fVar60 + fVar54 * auVar81._8_4_;
          auVar90._12_4_ = fVar60 + fVar54 * auVar81._12_4_;
          auVar90._16_4_ = fVar60 + fVar54 * auVar81._16_4_;
          auVar90._20_4_ = fVar60 + fVar54 * auVar81._20_4_;
          auVar90._24_4_ = fVar60 + fVar54 * auVar81._24_4_;
          auVar90._28_4_ = fVar60 + auVar81._28_4_;
          auVar101._8_8_ = 0;
          auVar101._0_8_ = *(ulong *)((long)puVar47 + uVar50);
          auVar92 = vpmovzxbd_avx(auVar101);
          auVar103._8_8_ = 0;
          auVar103._0_8_ = *(ulong *)((long)puVar47 + uVar50 + 4);
          auVar83 = vpmovzxbd_avx(auVar103);
          auVar102._16_16_ = auVar83;
          auVar102._0_16_ = auVar92;
          auVar81 = vcvtdq2ps_avx(auVar102);
          fVar59 = *(float *)(puVar47 + 7);
          auVar97._0_4_ = fVar60 + fVar54 * auVar81._0_4_;
          auVar97._4_4_ = fVar60 + fVar54 * auVar81._4_4_;
          auVar97._8_4_ = fVar60 + fVar54 * auVar81._8_4_;
          auVar97._12_4_ = fVar60 + fVar54 * auVar81._12_4_;
          auVar97._16_4_ = fVar60 + fVar54 * auVar81._16_4_;
          auVar97._20_4_ = fVar60 + fVar54 * auVar81._20_4_;
          auVar97._24_4_ = fVar60 + fVar54 * auVar81._24_4_;
          auVar97._28_4_ = fVar60 + fVar54;
          fVar54 = *(float *)((long)puVar47 + 0x44);
          auVar104._8_8_ = 0;
          auVar104._0_8_ = puVar47[uVar43 + 4];
          auVar92 = vpmovzxbd_avx(auVar104);
          auVar107._8_8_ = 0;
          auVar107._0_8_ = *(ulong *)((long)puVar47 + lVar2 + 0x24);
          auVar83 = vpmovzxbd_avx(auVar107);
          auVar105._16_16_ = auVar83;
          auVar105._0_16_ = auVar92;
          auVar108._8_8_ = 0;
          auVar108._0_8_ = *(ulong *)((long)puVar47 + uVar53);
          auVar92 = vpmovzxbd_avx(auVar108);
          auVar113._8_8_ = 0;
          auVar113._0_8_ = *(ulong *)((long)puVar47 + uVar53 + 4);
          auVar83 = vpmovzxbd_avx(auVar113);
          auVar109._16_16_ = auVar83;
          auVar109._0_16_ = auVar92;
          auVar81 = vcvtdq2ps_avx(auVar105);
          auVar6 = vcvtdq2ps_avx(auVar109);
          auVar106._0_4_ = auVar81._0_4_ * fVar54 + fVar59;
          auVar106._4_4_ = auVar81._4_4_ * fVar54 + fVar59;
          auVar106._8_4_ = auVar81._8_4_ * fVar54 + fVar59;
          auVar106._12_4_ = auVar81._12_4_ * fVar54 + fVar59;
          auVar106._16_4_ = auVar81._16_4_ * fVar54 + fVar59;
          auVar106._20_4_ = auVar81._20_4_ * fVar54 + fVar59;
          auVar106._24_4_ = auVar81._24_4_ * fVar54 + fVar59;
          auVar106._28_4_ = auVar81._28_4_ + fVar59;
          auVar99._0_4_ = fVar59 + auVar6._0_4_ * fVar54;
          auVar99._4_4_ = fVar59 + auVar6._4_4_ * fVar54;
          auVar99._8_4_ = fVar59 + auVar6._8_4_ * fVar54;
          auVar99._12_4_ = fVar59 + auVar6._12_4_ * fVar54;
          auVar99._16_4_ = fVar59 + auVar6._16_4_ * fVar54;
          auVar99._20_4_ = fVar59 + auVar6._20_4_ * fVar54;
          auVar99._24_4_ = fVar59 + auVar6._24_4_ * fVar54;
          auVar99._28_4_ = fVar59 + fVar54;
          auVar81 = vsubps_avx(auVar82,auVar115._0_32_);
          auVar6._4_4_ = auVar126._4_4_ * auVar81._4_4_;
          auVar6._0_4_ = auVar126._0_4_ * auVar81._0_4_;
          auVar6._8_4_ = auVar126._8_4_ * auVar81._8_4_;
          auVar6._12_4_ = auVar126._12_4_ * auVar81._12_4_;
          auVar6._16_4_ = auVar126._16_4_ * auVar81._16_4_;
          auVar6._20_4_ = auVar126._20_4_ * auVar81._20_4_;
          auVar6._24_4_ = auVar126._24_4_ * auVar81._24_4_;
          auVar6._28_4_ = auVar81._28_4_;
          auVar81 = vsubps_avx(auVar90,auVar123._0_32_);
          auVar17._4_4_ = auVar128._4_4_ * auVar81._4_4_;
          auVar17._0_4_ = auVar128._0_4_ * auVar81._0_4_;
          auVar17._8_4_ = auVar128._8_4_ * auVar81._8_4_;
          auVar17._12_4_ = auVar128._12_4_ * auVar81._12_4_;
          auVar17._16_4_ = auVar128._16_4_ * auVar81._16_4_;
          auVar17._20_4_ = auVar128._20_4_ * auVar81._20_4_;
          auVar17._24_4_ = auVar128._24_4_ * auVar81._24_4_;
          auVar17._28_4_ = auVar81._28_4_;
          auVar81 = vmaxps_avx(auVar6,auVar17);
          auVar6 = vsubps_avx(auVar106,auVar124._0_32_);
          auVar18._4_4_ = (float)local_11f8._4_4_ * auVar6._4_4_;
          auVar18._0_4_ = (float)local_11f8._0_4_ * auVar6._0_4_;
          auVar18._8_4_ = fStack_11f0 * auVar6._8_4_;
          auVar18._12_4_ = fStack_11ec * auVar6._12_4_;
          auVar18._16_4_ = fStack_11e8 * auVar6._16_4_;
          auVar18._20_4_ = fStack_11e4 * auVar6._20_4_;
          auVar18._24_4_ = fStack_11e0 * auVar6._24_4_;
          auVar18._28_4_ = auVar6._28_4_;
          auVar6 = vmaxps_avx(auVar18,local_1218);
          auVar81 = vmaxps_avx(auVar81,auVar6);
          auVar6 = vsubps_avx(auVar86,auVar115._0_32_);
          auVar19._4_4_ = auVar126._4_4_ * auVar6._4_4_;
          auVar19._0_4_ = auVar126._0_4_ * auVar6._0_4_;
          auVar19._8_4_ = auVar126._8_4_ * auVar6._8_4_;
          auVar19._12_4_ = auVar126._12_4_ * auVar6._12_4_;
          auVar19._16_4_ = auVar126._16_4_ * auVar6._16_4_;
          auVar19._20_4_ = auVar126._20_4_ * auVar6._20_4_;
          auVar19._24_4_ = auVar126._24_4_ * auVar6._24_4_;
          auVar19._28_4_ = auVar6._28_4_;
          auVar6 = vsubps_avx(auVar97,auVar123._0_32_);
          auVar20._4_4_ = auVar128._4_4_ * auVar6._4_4_;
          auVar20._0_4_ = auVar128._0_4_ * auVar6._0_4_;
          auVar20._8_4_ = auVar128._8_4_ * auVar6._8_4_;
          auVar20._12_4_ = auVar128._12_4_ * auVar6._12_4_;
          auVar20._16_4_ = auVar128._16_4_ * auVar6._16_4_;
          auVar20._20_4_ = auVar128._20_4_ * auVar6._20_4_;
          auVar20._24_4_ = auVar128._24_4_ * auVar6._24_4_;
          auVar20._28_4_ = auVar6._28_4_;
          auVar6 = vminps_avx(auVar19,auVar20);
          auVar17 = vsubps_avx(auVar99,auVar124._0_32_);
          auVar21._4_4_ = (float)local_11f8._4_4_ * auVar17._4_4_;
          auVar21._0_4_ = (float)local_11f8._0_4_ * auVar17._0_4_;
          auVar21._8_4_ = fStack_11f0 * auVar17._8_4_;
          auVar21._12_4_ = fStack_11ec * auVar17._12_4_;
          auVar21._16_4_ = fStack_11e8 * auVar17._16_4_;
          auVar21._20_4_ = fStack_11e4 * auVar17._20_4_;
          auVar21._24_4_ = fStack_11e0 * auVar17._24_4_;
          auVar21._28_4_ = auVar17._28_4_;
          auVar17 = vminps_avx(auVar21,local_1238);
          auVar6 = vminps_avx(auVar6,auVar17);
          auVar81 = vcmpps_avx(auVar81,auVar6,2);
          auVar92 = vpcmpeqd_avx(auVar6._0_16_,auVar6._0_16_);
          auVar87 = vpmovsxbd_avx(auVar87 ^ auVar92);
          auVar55 = vpmovsxbd_avx(auVar55 ^ auVar92);
          auVar58._16_16_ = auVar55;
          auVar58._0_16_ = auVar87;
          auVar6 = vcvtdq2ps_avx(auVar58);
          auVar72._8_4_ = 0xbf800000;
          auVar72._0_8_ = 0xbf800000bf800000;
          auVar72._12_4_ = 0xbf800000;
          auVar72._16_4_ = 0xbf800000;
          auVar72._20_4_ = 0xbf800000;
          auVar72._24_4_ = 0xbf800000;
          auVar72._28_4_ = 0xbf800000;
          auVar6 = vcmpps_avx(auVar72,auVar6,1);
          auVar81 = vandps_avx(auVar81,auVar6);
          uVar46 = vmovmskps_avx(auVar81);
          if (uVar46 == 0) {
            if (local_1410 == &local_11d8) {
              return;
            }
            goto LAB_002ef154;
          }
          uVar46 = uVar46 & 0xff;
          lVar49 = 0;
          if (uVar46 != 0) {
            for (; (uVar46 >> lVar49 & 1) == 0; lVar49 = lVar49 + 1) {
            }
          }
          uVar52 = *(ulong *)(uVar44 + lVar49 * 8);
          uVar46 = uVar46 - 1 & uVar46;
          if (uVar46 != 0) {
            *local_1410 = uVar52;
            local_1410 = local_1410 + 1;
            lVar49 = 0;
            if (uVar46 != 0) {
              for (; (uVar46 >> lVar49 & 1) == 0; lVar49 = lVar49 + 1) {
              }
            }
            uVar52 = *(ulong *)(uVar44 + lVar49 * 8);
            uVar46 = uVar46 - 1 & uVar46;
            uVar48 = (ulong)uVar46;
            if (uVar46 != 0) {
              do {
                *local_1410 = uVar52;
                local_1410 = local_1410 + 1;
                lVar49 = 0;
                if (uVar48 != 0) {
                  for (; (uVar48 >> lVar49 & 1) == 0; lVar49 = lVar49 + 1) {
                  }
                }
                uVar52 = *(ulong *)(uVar44 + lVar49 * 8);
                uVar48 = uVar48 & uVar48 - 1;
              } while (uVar48 != 0);
            }
          }
        }
        local_1420 = (ulong)((uint)uVar52 & 0xf) - 8;
        if (local_1420 != 0) {
          uVar52 = uVar52 & 0xfffffffffffffff0;
          local_1428 = 0;
          do {
            lVar49 = local_1428 * 0xb0;
            pfVar3 = (float *)(uVar52 + 0x80 + lVar49);
            fVar22 = *pfVar3;
            fVar23 = pfVar3[1];
            fVar24 = pfVar3[2];
            fVar25 = pfVar3[3];
            pfVar3 = (float *)(uVar52 + 0x40 + lVar49);
            fVar26 = *pfVar3;
            fVar27 = pfVar3[1];
            fVar28 = pfVar3[2];
            fVar29 = pfVar3[3];
            auVar56._0_4_ = fVar22 * fVar26;
            auVar56._4_4_ = fVar23 * fVar27;
            auVar56._8_4_ = fVar24 * fVar28;
            auVar56._12_4_ = fVar25 * fVar29;
            pfVar3 = (float *)(uVar52 + 0x70 + lVar49);
            fVar30 = *pfVar3;
            fVar31 = pfVar3[1];
            fVar32 = pfVar3[2];
            fVar33 = pfVar3[3];
            pfVar3 = (float *)(uVar52 + 0x50 + lVar49);
            fVar34 = *pfVar3;
            fVar35 = pfVar3[1];
            fVar36 = pfVar3[2];
            fVar37 = pfVar3[3];
            auVar63._0_4_ = fVar30 * fVar34;
            auVar63._4_4_ = fVar31 * fVar35;
            auVar63._8_4_ = fVar32 * fVar36;
            auVar63._12_4_ = fVar33 * fVar37;
            local_1448 = vsubps_avx(auVar63,auVar56);
            auVar87 = *(undefined1 (*) [16])(uVar52 + 0x60 + lVar49);
            fVar114 = auVar87._0_4_;
            auVar64._0_4_ = fVar114 * fVar34;
            fVar116 = auVar87._4_4_;
            auVar64._4_4_ = fVar116 * fVar35;
            fVar117 = auVar87._8_4_;
            auVar64._8_4_ = fVar117 * fVar36;
            fVar118 = auVar87._12_4_;
            auVar64._12_4_ = fVar118 * fVar37;
            pfVar3 = (float *)(uVar52 + 0x30 + lVar49);
            fVar38 = *pfVar3;
            fVar39 = pfVar3[1];
            fVar40 = pfVar3[2];
            fVar41 = pfVar3[3];
            auVar75._0_4_ = fVar22 * fVar38;
            auVar75._4_4_ = fVar23 * fVar39;
            auVar75._8_4_ = fVar24 * fVar40;
            auVar75._12_4_ = fVar25 * fVar41;
            local_1498 = vsubps_avx(auVar75,auVar64);
            auVar76._0_4_ = fVar30 * fVar38;
            auVar76._4_4_ = fVar31 * fVar39;
            auVar76._8_4_ = fVar32 * fVar40;
            auVar76._12_4_ = fVar33 * fVar41;
            auVar119._0_4_ = fVar114 * fVar26;
            auVar119._4_4_ = fVar116 * fVar27;
            auVar119._8_4_ = fVar117 * fVar28;
            auVar119._12_4_ = fVar118 * fVar29;
            local_1488 = vsubps_avx(auVar119,auVar76);
            uVar4 = *(undefined4 *)&(ray->org).field_0;
            auVar120._4_4_ = uVar4;
            auVar120._0_4_ = uVar4;
            auVar120._8_4_ = uVar4;
            auVar120._12_4_ = uVar4;
            local_1458 = vsubps_avx(*(undefined1 (*) [16])(uVar52 + lVar49),auVar120);
            uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar121._4_4_ = uVar4;
            auVar121._0_4_ = uVar4;
            auVar121._8_4_ = uVar4;
            auVar121._12_4_ = uVar4;
            local_14a8 = vsubps_avx(*(undefined1 (*) [16])(uVar52 + 0x10 + lVar49),auVar121);
            uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar122._4_4_ = uVar4;
            auVar122._0_4_ = uVar4;
            auVar122._8_4_ = uVar4;
            auVar122._12_4_ = uVar4;
            local_1468 = vsubps_avx(*(undefined1 (*) [16])(uVar52 + 0x20 + lVar49),auVar122);
            fVar54 = (ray->dir).field_0.m128[1];
            fVar59 = (ray->dir).field_0.m128[2];
            fVar61 = local_1468._0_4_;
            auVar125._0_4_ = fVar54 * fVar61;
            fVar8 = local_1468._4_4_;
            auVar125._4_4_ = fVar54 * fVar8;
            fVar11 = local_1468._8_4_;
            auVar125._8_4_ = fVar54 * fVar11;
            fVar14 = local_1468._12_4_;
            auVar125._12_4_ = fVar54 * fVar14;
            fVar91 = local_14a8._0_4_;
            auVar127._0_4_ = fVar59 * fVar91;
            fVar9 = local_14a8._4_4_;
            auVar127._4_4_ = fVar59 * fVar9;
            fVar12 = local_14a8._8_4_;
            auVar127._8_4_ = fVar59 * fVar12;
            fVar15 = local_14a8._12_4_;
            auVar127._12_4_ = fVar59 * fVar15;
            auVar55 = vsubps_avx(auVar127,auVar125);
            fVar60 = (ray->dir).field_0.m128[0];
            fVar7 = local_1458._0_4_;
            auVar57._0_4_ = fVar59 * fVar7;
            fVar10 = local_1458._4_4_;
            auVar57._4_4_ = fVar59 * fVar10;
            fVar13 = local_1458._8_4_;
            auVar57._8_4_ = fVar59 * fVar13;
            fVar16 = local_1458._12_4_;
            auVar57._12_4_ = fVar59 * fVar16;
            auVar65._0_4_ = fVar60 * fVar61;
            auVar65._4_4_ = fVar60 * fVar8;
            auVar65._8_4_ = fVar60 * fVar11;
            auVar65._12_4_ = fVar60 * fVar14;
            auVar92 = vsubps_avx(auVar65,auVar57);
            auVar66._0_4_ = fVar60 * fVar91;
            auVar66._4_4_ = fVar60 * fVar9;
            auVar66._8_4_ = fVar60 * fVar12;
            auVar66._12_4_ = fVar60 * fVar15;
            auVar77._0_4_ = fVar54 * fVar7;
            auVar77._4_4_ = fVar54 * fVar10;
            auVar77._8_4_ = fVar54 * fVar13;
            auVar77._12_4_ = fVar54 * fVar16;
            auVar83 = vsubps_avx(auVar77,auVar66);
            auVar93 = local_1488;
            auVar84 = local_1498;
            auVar78._0_4_ =
                 local_1448._0_4_ * fVar60 + fVar54 * local_1498._0_4_ + fVar59 * local_1488._0_4_;
            auVar78._4_4_ =
                 local_1448._4_4_ * fVar60 + fVar54 * local_1498._4_4_ + fVar59 * local_1488._4_4_;
            auVar78._8_4_ =
                 local_1448._8_4_ * fVar60 + fVar54 * local_1498._8_4_ + fVar59 * local_1488._8_4_;
            auVar78._12_4_ =
                 local_1448._12_4_ * fVar60 +
                 fVar54 * local_1498._12_4_ + fVar59 * local_1488._12_4_;
            auVar67._8_8_ = 0x8000000080000000;
            auVar67._0_8_ = 0x8000000080000000;
            auVar87 = vandps_avx(auVar78,auVar67);
            uVar46 = auVar87._0_4_;
            local_1398._0_4_ =
                 (float)(uVar46 ^ (uint)(fVar114 * auVar55._0_4_ +
                                        fVar22 * auVar83._0_4_ + fVar30 * auVar92._0_4_));
            uVar110 = auVar87._4_4_;
            local_1398._4_4_ =
                 (float)(uVar110 ^
                        (uint)(fVar116 * auVar55._4_4_ +
                              fVar23 * auVar83._4_4_ + fVar31 * auVar92._4_4_));
            uVar111 = auVar87._8_4_;
            local_1398._8_4_ =
                 (float)(uVar111 ^
                        (uint)(fVar117 * auVar55._8_4_ +
                              fVar24 * auVar83._8_4_ + fVar32 * auVar92._8_4_));
            uVar112 = auVar87._12_4_;
            local_1398._12_4_ =
                 (float)(uVar112 ^
                        (uint)(fVar118 * auVar55._12_4_ +
                              fVar25 * auVar83._12_4_ + fVar33 * auVar92._12_4_));
            local_1388._0_4_ =
                 (float)(uVar46 ^ (uint)(fVar38 * auVar55._0_4_ +
                                        fVar34 * auVar83._0_4_ + fVar26 * auVar92._0_4_));
            local_1388._4_4_ =
                 (float)(uVar110 ^
                        (uint)(fVar39 * auVar55._4_4_ +
                              fVar35 * auVar83._4_4_ + fVar27 * auVar92._4_4_));
            local_1388._8_4_ =
                 (float)(uVar111 ^
                        (uint)(fVar40 * auVar55._8_4_ +
                              fVar36 * auVar83._8_4_ + fVar28 * auVar92._8_4_));
            local_1388._12_4_ =
                 (float)(uVar112 ^
                        (uint)(fVar41 * auVar55._12_4_ +
                              fVar37 * auVar83._12_4_ + fVar29 * auVar92._12_4_));
            auVar92 = ZEXT416(0) << 0x20;
            auVar87 = vcmpps_avx(local_1398,auVar92,5);
            auVar55 = vcmpps_avx(local_1388,auVar92,5);
            auVar87 = vandps_avx(auVar87,auVar55);
            auVar68._8_4_ = 0x7fffffff;
            auVar68._0_8_ = 0x7fffffff7fffffff;
            auVar68._12_4_ = 0x7fffffff;
            local_1368 = vandps_avx(auVar78,auVar68);
            auVar55 = vcmpps_avx(auVar92,auVar78,4);
            auVar87 = vandps_avx(auVar87,auVar55);
            auVar69._0_4_ = local_1398._0_4_ + local_1388._0_4_;
            auVar69._4_4_ = local_1398._4_4_ + local_1388._4_4_;
            auVar69._8_4_ = local_1398._8_4_ + local_1388._8_4_;
            auVar69._12_4_ = local_1398._12_4_ + local_1388._12_4_;
            auVar55 = vcmpps_avx(auVar69,local_1368,2);
            auVar87 = vandps_avx(auVar87,auVar55);
            auVar55 = local_13a8 & auVar87;
            if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar55[0xf] < '\0') {
              auVar87 = vandps_avx(auVar87,local_13a8);
              local_1378._0_4_ =
                   (float)(uVar46 ^ (uint)(local_1448._0_4_ * fVar7 +
                                          fVar91 * local_1498._0_4_ + fVar61 * local_1488._0_4_));
              local_1378._4_4_ =
                   (float)(uVar110 ^
                          (uint)(local_1448._4_4_ * fVar10 +
                                fVar9 * local_1498._4_4_ + fVar8 * local_1488._4_4_));
              local_1378._8_4_ =
                   (float)(uVar111 ^
                          (uint)(local_1448._8_4_ * fVar13 +
                                fVar12 * local_1498._8_4_ + fVar11 * local_1488._8_4_));
              local_1378._12_4_ =
                   (float)(uVar112 ^
                          (uint)(local_1448._12_4_ * fVar16 +
                                fVar15 * local_1498._12_4_ + fVar14 * local_1488._12_4_));
              fVar54 = (ray->org).field_0.m128[3];
              fVar59 = local_1368._0_4_;
              auVar70._0_4_ = fVar59 * fVar54;
              fVar60 = local_1368._4_4_;
              auVar70._4_4_ = fVar60 * fVar54;
              fVar61 = local_1368._8_4_;
              auVar70._8_4_ = fVar61 * fVar54;
              fVar91 = local_1368._12_4_;
              auVar70._12_4_ = fVar91 * fVar54;
              auVar55 = vcmpps_avx(auVar70,local_1378,1);
              fVar54 = ray->tfar;
              auVar79._0_4_ = fVar59 * fVar54;
              auVar79._4_4_ = fVar60 * fVar54;
              auVar79._8_4_ = fVar61 * fVar54;
              auVar79._12_4_ = fVar91 * fVar54;
              auVar92 = vcmpps_avx(local_1378,auVar79,2);
              auVar55 = vandps_avx(auVar92,auVar55);
              local_1348 = vandps_avx(auVar55,auVar87);
              uVar46 = vmovmskps_avx(local_1348);
              if (uVar46 != 0) {
                local_1308 = local_1448;
                local_12f8 = local_1498._0_8_;
                uStack_12f0 = local_1498._8_8_;
                local_12e8 = local_1488._0_8_;
                uStack_12e0 = local_1488._8_8_;
                local_1448._0_8_ = local_1470->scene;
                auVar87 = vrcpps_avx(local_1368);
                fVar54 = auVar87._0_4_;
                auVar71._0_4_ = fVar59 * fVar54;
                fVar59 = auVar87._4_4_;
                auVar71._4_4_ = fVar60 * fVar59;
                fVar60 = auVar87._8_4_;
                auVar71._8_4_ = fVar61 * fVar60;
                fVar61 = auVar87._12_4_;
                auVar71._12_4_ = fVar91 * fVar61;
                auVar80._8_4_ = 0x3f800000;
                auVar80._0_8_ = 0x3f8000003f800000;
                auVar80._12_4_ = 0x3f800000;
                auVar87 = vsubps_avx(auVar80,auVar71);
                fVar54 = fVar54 + fVar54 * auVar87._0_4_;
                fVar59 = fVar59 + fVar59 * auVar87._4_4_;
                fVar60 = fVar60 + fVar60 * auVar87._8_4_;
                fVar61 = fVar61 + fVar61 * auVar87._12_4_;
                local_1318[0] = fVar54 * local_1378._0_4_;
                local_1318[1] = fVar59 * local_1378._4_4_;
                local_1318[2] = fVar60 * local_1378._8_4_;
                local_1318[3] = fVar61 * local_1378._12_4_;
                local_1338._0_4_ = fVar54 * local_1398._0_4_;
                local_1338._4_4_ = fVar59 * local_1398._4_4_;
                local_1338._8_4_ = fVar60 * local_1398._8_4_;
                local_1338._12_4_ = fVar61 * local_1398._12_4_;
                local_1328._0_4_ = fVar54 * local_1388._0_4_;
                local_1328._4_4_ = fVar59 * local_1388._4_4_;
                local_1328._8_4_ = fVar60 * local_1388._8_4_;
                local_1328._12_4_ = fVar61 * local_1388._12_4_;
                uVar44 = (ulong)(uVar46 & 0xff);
                local_1458._0_8_ = lVar49 + uVar52;
                lVar49 = lVar49 + uVar52;
                local_1498 = auVar84;
                local_1488 = auVar93;
                do {
                  local_1488._0_8_ = uVar44;
                  uVar48 = 0;
                  if (uVar44 != 0) {
                    for (; (uVar44 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                    }
                  }
                  local_1498._0_8_ = uVar48;
                  local_13f0 = *(uint *)(lVar49 + 0x90 + uVar48 * 4);
                  uVar45 = CONCAT44(0,local_13f0);
                  local_14a8._0_8_ = uVar45;
                  local_1430 = *(long *)(*(long *)(local_1448._0_8_ + 0x1e8) + uVar45 * 8);
                  if ((*(uint *)(local_1430 + 0x34) & ray->mask) == 0) {
                    uVar44 = uVar44 ^ 1L << (uVar48 & 0x3f);
                  }
                  else {
                    if ((local_1470->args->filter == (RTCFilterFunctionN)0x0) &&
                       (local_14a8._0_8_ = ray, *(long *)(local_1430 + 0x48) == 0))
                    goto LAB_002ef946;
                    local_1468._0_8_ = local_1470->args;
                    local_13c8 = local_1470->user;
                    local_1408 = *(undefined4 *)(local_1308 + uVar48 * 4);
                    local_1404 = *(undefined4 *)((long)&local_12f8 + uVar48 * 4);
                    local_1400 = *(undefined4 *)((long)&local_12e8 + uVar48 * 4);
                    local_13fc = *(undefined4 *)(local_1338 + uVar48 * 4);
                    local_13f8 = *(undefined4 *)(local_1328 + uVar48 * 4);
                    local_13f4 = *(undefined4 *)(local_1458._0_8_ + 0xa0 + uVar48 * 4);
                    local_13ec = local_13c8->instID[0];
                    local_13e8 = local_13c8->instPrimID[0];
                    fVar54 = ray->tfar;
                    ray->tfar = local_1318[uVar48];
                    local_14ac = -1;
                    local_13d8 = &local_14ac;
                    local_13d0 = *(undefined8 *)(local_1430 + 0x18);
                    local_14a8._0_8_ = ray;
                    local_13b8 = &local_1408;
                    local_13b0 = 1;
                    local_13c0 = ray;
                    if ((*(code **)(local_1430 + 0x48) == (code *)0x0) ||
                       ((**(code **)(local_1430 + 0x48))(&local_13d8), *local_13d8 != 0)) {
                      if ((*(code **)(local_1468._0_8_ + 0x10) == (code *)0x0) ||
                         (((*(byte *)local_1468._0_8_ & 2) == 0 &&
                          ((*(byte *)(local_1430 + 0x3e) & 0x40) == 0)))) {
LAB_002ef946:
                        ((Ray *)local_14a8._0_8_)->tfar = -INFINITY;
                        return;
                      }
                      (**(code **)(local_1468._0_8_ + 0x10))(&local_13d8);
                      if (*local_13d8 != 0) goto LAB_002ef946;
                    }
                    *(float *)(local_14a8._0_8_ + 0x20) = fVar54;
                    uVar44 = local_1488._0_8_ ^ 1L << (local_1498._0_8_ & 0x3f);
                    ray = (Ray *)local_14a8._0_8_;
                  }
                  lVar49 = local_1458._0_8_;
                } while (uVar44 != 0);
              }
            }
            local_1428 = local_1428 + 1;
          } while (local_1428 != local_1420);
        }
        auVar115 = ZEXT3264(local_1258);
        auVar123 = ZEXT3264(local_1278);
        auVar124 = ZEXT3264(local_1298);
        auVar126 = ZEXT3264(local_12b8);
        auVar128 = ZEXT3264(local_12d8);
      } while (local_1410 != &local_11d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }